

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::createImageFormatTests
               (TestCaseGroup *testGroup,Function testFunction)

{
  TestContext *pTVar1;
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  ImageFormatPropertyCase arg0_01;
  TestNode *pTVar2;
  string *local_b0 [2];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  undefined4 local_60;
  undefined4 uStack_5c;
  Function local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  Function local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  local_90._M_allocated_capacity = (size_type)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"1d","");
  local_b0[0] = (string *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  uStack_38 = 0;
  local_30 = 2;
  arg0._20_4_ = uStack_2c;
  arg0.tiling = 2;
  arg0.format = VK_FORMAT_UNDEFINED;
  arg0.imageType = VK_IMAGE_TYPE_1D;
  arg0.testFunction = testFunction;
  local_40 = testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,(string *)local_90._M_allocated_capacity,local_b0[0],
                       createImageFormatTypeTests,arg0)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_b0[0] != (string *)local_a0) {
    operator_delete(local_b0[0],(ulong)(local_a0._0_8_ + 1));
  }
  if ((string *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,(ulong)(local_80._M_dataplus._M_p + 1));
  }
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  local_90._M_allocated_capacity = (size_type)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"2d","");
  local_b0[0] = (string *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  uStack_50 = 0x100000000;
  local_48 = 2;
  arg0_00._20_4_ = uStack_44;
  arg0_00.tiling = 2;
  arg0_00.format = VK_FORMAT_UNDEFINED;
  arg0_00.imageType = VK_IMAGE_TYPE_2D;
  arg0_00.testFunction = testFunction;
  local_58 = testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,(string *)local_90._M_allocated_capacity,local_b0[0],
                       createImageFormatTypeTests,arg0_00)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_b0[0] != (string *)local_a0) {
    operator_delete(local_b0[0],(ulong)(local_a0._0_8_ + 1));
  }
  if ((string *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,(ulong)(local_80._M_dataplus._M_p + 1));
  }
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  local_90._M_allocated_capacity = (size_type)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"3d","");
  local_b0[0] = (string *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_80.field_2._8_8_ = 0x200000000;
  local_60 = 2;
  arg0_01._20_4_ = uStack_5c;
  arg0_01.tiling = 2;
  arg0_01.format = VK_FORMAT_UNDEFINED;
  arg0_01.imageType = VK_IMAGE_TYPE_3D;
  arg0_01.testFunction = testFunction;
  local_80.field_2._M_allocated_capacity = (size_type)testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,(string *)local_90._M_allocated_capacity,local_b0[0],
                       createImageFormatTypeTests,arg0_01)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_b0[0] != (string *)local_a0) {
    operator_delete(local_b0[0],(ulong)(local_a0._0_8_ + 1));
  }
  if ((string *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,(ulong)(local_80._M_dataplus._M_p + 1));
  }
  return;
}

Assistant:

void createImageFormatTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase::Function testFunction)
{
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "1d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_1D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "2d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "3d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_3D, VK_IMAGE_TILING_LAST)));
}